

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test<long>::Body
          (iu_TypedPrintToTest_x_iutest_x_Print_Test<long> *this)

{
  Fixed *pFVar1;
  long *v;
  AssertionHelper local_7a0;
  string local_770;
  Fixed local_750;
  AssertionHelper local_5c8;
  string local_598;
  Fixed local_578;
  AssertionHelper local_3f0;
  string local_3c0;
  Fixed local_3a0;
  AssertionHelper local_218;
  string local_1d8;
  Fixed local_1b8;
  undefined8 local_30;
  TypeParam_conflict7 d;
  TypeParam_conflict7 c;
  TypeParam_conflict7 *b;
  TypeParam_conflict7 a;
  iu_TypedPrintToTest_x_iutest_x_Print_Test<long> *this_local;
  
  b = (TypeParam_conflict7 *)0x0;
  d = 0;
  local_30 = 0;
  c = (TypeParam_conflict7)&b;
  a = (TypeParam_conflict7)this;
  memset(&local_1b8,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1b8);
  iutest::PrintToString<long>(&local_1d8,(long *)&b);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_1b8,&local_1d8);
  iutest::AssertionHelper::AssertionHelper
            (&local_218,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3db,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_218,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1b8);
  memset(&local_3a0,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_3a0);
  iutest::PrintToString<long>(&local_3c0,(long *)c);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_3a0,&local_3c0);
  iutest::AssertionHelper::AssertionHelper
            (&local_3f0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3dc,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_3f0,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_3f0);
  std::__cxx11::string::~string((string *)&local_3c0);
  iutest::AssertionHelper::Fixed::~Fixed(&local_3a0);
  memset(&local_578,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_578);
  iutest::PrintToString<long>(&local_598,&d);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_578,&local_598);
  iutest::AssertionHelper::AssertionHelper
            (&local_5c8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3dd,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_5c8,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_5c8);
  std::__cxx11::string::~string((string *)&local_598);
  iutest::AssertionHelper::Fixed::~Fixed(&local_578);
  memset(&local_750,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_750);
  iutest::PrintToString<long_volatile>(&local_770,(iutest *)&local_30,v);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_750,&local_770);
  iutest::AssertionHelper::AssertionHelper
            (&local_7a0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3de,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_7a0,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_7a0);
  std::__cxx11::string::~string((string *)&local_770);
  iutest::AssertionHelper::Fixed::~Fixed(&local_750);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedPrintToTest, Print)
{
    TypeParam a = 0;
    TypeParam& b = a;
    const TypeParam c = a;
    const volatile TypeParam d = a;

    IUTEST_SUCCEED() << ::iutest::PrintToString(a);
    IUTEST_SUCCEED() << ::iutest::PrintToString(b);
    IUTEST_SUCCEED() << ::iutest::PrintToString(c);
    IUTEST_SUCCEED() << ::iutest::PrintToString(d);
}